

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O3

bool __thiscall asl::HttpMessage::sendHeaders(HttpMessage *this)

{
  SmartObject_ *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  undefined8 s_00;
  long lVar8;
  KeyVal *pKVar9;
  String s;
  String contentlength;
  String local_78;
  String local_60;
  String local_48;
  
  local_78.field_2._space[0] = '\0';
  local_78._size = 0;
  local_78._len = 0;
  if ((this->_command)._size == 0) {
    paVar7 = &(this->_command).field_2;
  }
  else {
    paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_command).field_2._str;
  }
  String::append(&local_78,paVar7->_space,(this->_command)._len);
  String::append(&local_78,"\r\n",2);
  pKVar9 = (this->_headers).super_Map<asl::String,_asl::String>.a._a;
  if (0 < *(int *)&pKVar9[-1].value.field_2) {
    lVar8 = 0x20;
    lVar5 = 0;
    do {
      if (*(int *)((long)pKVar9 + lVar8 + -0x20) == 0) {
        pcVar6 = (char *)((long)pKVar9 + lVar8 + -0x18);
      }
      else {
        pcVar6 = *(char **)((long)pKVar9 + lVar8 + -0x18);
      }
      String::append(&local_78,pcVar6,*(int *)((long)pKVar9 + lVar8 + -0x1c));
      String::append(&local_78,": ",2);
      if (*(int *)((long)pKVar9 + lVar8 + -8) == 0) {
        pcVar6 = (char *)((long)&(pKVar9->key)._size + lVar8);
      }
      else {
        pcVar6 = *(char **)((long)&(pKVar9->key)._size + lVar8);
      }
      String::append(&local_78,pcVar6,*(int *)((long)pKVar9 + lVar8 + -4));
      String::append(&local_78,"\r\n",2);
      pKVar9 = (this->_headers).super_Map<asl::String,_asl::String>.a._a;
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0x30;
    } while (lVar5 < *(int *)&pKVar9[-1].value.field_2);
  }
  String::append(&local_78,"\r\n",2);
  if (local_78._size == 0) {
    paVar7 = &local_78.field_2;
  }
  else {
    paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)
             CONCAT71(local_78.field_2._1_7_,local_78.field_2._space[0]);
  }
  pSVar1 = (this->_socket->super_SmartObject)._p;
  iVar3 = (*pSVar1->_vptr_SmartObject_[0xe])(pSVar1,paVar7,(ulong)local_78._0_8_ >> 0x20);
  iVar2 = local_78._len;
  if (local_78._len <= iVar3) {
    this->_headersSent = true;
    String::String(&local_48,"Content-Length");
    header(&local_60,this,&local_48);
    if (local_48._size != 0) {
      free(local_48.field_2._str);
    }
    this->_chunked = local_60._len < 1;
    if (local_60._len < 1) {
      iVar4 = 0;
    }
    else {
      s_00 = local_60.field_2._str;
      if (local_60._size == 0) {
        s_00 = &local_60.field_2;
      }
      iVar4 = myatoi((char *)s_00);
    }
    ((this->_status)._p)->p->totalSend = iVar4;
    if (local_60._size != 0) {
      free(local_60.field_2._str);
    }
  }
  if (local_78._size != 0) {
    free((void *)CONCAT71(local_78.field_2._1_7_,local_78.field_2._space[0]));
  }
  return iVar2 <= iVar3;
}

Assistant:

bool HttpMessage::sendHeaders()
{
	String s;
	s << _command << "\r\n";
	foreach2(String& name, String& value, _headers)
	{
		s << name << ": " << value << "\r\n";
	}
	s << "\r\n";
	int sent = _socket->write(*s, s.length());
	if (sent < s.length())
		return false;
	_headersSent = true;
	String contentlength = header("Content-Length");
	_chunked = !contentlength.ok();
	_status->totalSend = _chunked ? 0 : int(contentlength);
	return true;
}